

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servlk.cpp
# Opt level: O2

void __thiscall
icu_63::LocaleKey::LocaleKey
          (LocaleKey *this,UnicodeString *primaryID,UnicodeString *canonicalPrimaryID,
          UnicodeString *canonicalFallbackID,int32_t kind)

{
  UnicodeString *this_00;
  short sVar1;
  UBool UVar2;
  int iVar3;
  
  ICUServiceKey::ICUServiceKey(&this->super_ICUServiceKey,primaryID);
  (this->super_ICUServiceKey).super_UObject._vptr_UObject = (_func_int **)&PTR__LocaleKey_002506e0;
  this->_kind = kind;
  this_00 = &this->_primaryID;
  UnicodeString::UnicodeString(this_00,canonicalPrimaryID);
  (this->_fallbackID).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_0024c170;
  (this->_fallbackID).fUnion.fStackFields.fLengthAndFlags = 2;
  (this->_currentID).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_0024c170;
  (this->_currentID).fUnion.fStackFields.fLengthAndFlags = 2;
  UnicodeString::setToBogus(&this->_fallbackID);
  sVar1 = (this->_primaryID).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar3 = (this->_primaryID).fUnion.fFields.fLength;
  }
  else {
    iVar3 = (int)sVar1 >> 5;
  }
  if ((canonicalFallbackID != (UnicodeString *)0x0) && (iVar3 != 0)) {
    UVar2 = UnicodeString::operator!=(this_00,canonicalFallbackID);
    if (UVar2 != '\0') {
      UnicodeString::operator=(&this->_fallbackID,canonicalFallbackID);
    }
  }
  UnicodeString::operator=(&this->_currentID,this_00);
  return;
}

Assistant:

LocaleKey::LocaleKey(const UnicodeString& primaryID,
                     const UnicodeString& canonicalPrimaryID,
                     const UnicodeString* canonicalFallbackID,
                     int32_t kind)
  : ICUServiceKey(primaryID)
  , _kind(kind)
  , _primaryID(canonicalPrimaryID)
  , _fallbackID()
  , _currentID()
{
    _fallbackID.setToBogus();
    if (_primaryID.length() != 0) {
        if (canonicalFallbackID != NULL && _primaryID != *canonicalFallbackID) {
            _fallbackID = *canonicalFallbackID;
        }
    }

    _currentID = _primaryID;
}